

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::use_default_format_selection(SwapchainBuilder *this)

{
  SwapchainBuilder *this_local;
  
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::clear
            (&(this->info).desired_formats);
  add_desired_formats(this,&(this->info).desired_formats);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::use_default_format_selection() {
    info.desired_formats.clear();
    add_desired_formats(info.desired_formats);
    return *this;
}